

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ql_manager.cc
# Opt level: O3

RC __thiscall QL_Manager::SetUpPrinterInsert(QL_Manager *this,DataAttrInfo *attributes)

{
  char *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  AttrCatEntry *pAVar7;
  
  if (0 < this->relEntries->attrCount) {
    pAVar7 = this->attrEntries;
    lVar5 = 0;
    lVar6 = 0;
    do {
      uVar2 = *(undefined8 *)(pAVar7->relName + lVar5);
      uVar3 = *(undefined8 *)(pAVar7->relName + lVar5 + 8);
      uVar4 = *(undefined8 *)(pAVar7->relName + lVar5 + 9 + 8);
      *(undefined8 *)(attributes->relName + 9) = *(undefined8 *)(pAVar7->relName + lVar5 + 9);
      *(undefined8 *)(attributes->relName + 0x11) = uVar4;
      *(undefined8 *)attributes->relName = uVar2;
      *(undefined8 *)(attributes->relName + 8) = uVar3;
      pcVar1 = this->attrEntries->attrName + lVar5;
      uVar2 = *(undefined8 *)pcVar1;
      uVar3 = *(undefined8 *)(pcVar1 + 8);
      pcVar1 = this->attrEntries->attrName + lVar5 + 9;
      uVar4 = *(undefined8 *)(pcVar1 + 8);
      *(undefined8 *)(attributes->attrName + 9) = *(undefined8 *)pcVar1;
      *(undefined8 *)(attributes->attrName + 0x11) = uVar4;
      *(undefined8 *)attributes->attrName = uVar2;
      *(undefined8 *)(attributes->attrName + 8) = uVar3;
      pAVar7 = this->attrEntries;
      uVar2 = *(undefined8 *)(pAVar7->attrName + lVar5 + 0x1b);
      uVar3 = *(undefined8 *)(pAVar7->attrName + lVar5 + 0x1b + 8);
      attributes->offset = (int)uVar2;
      attributes->attrType = (int)((ulong)uVar2 >> 0x20);
      attributes->attrLength = (int)uVar3;
      attributes->indexNo = (int)((ulong)uVar3 >> 0x20);
      lVar6 = lVar6 + 1;
      lVar5 = lVar5 + 0x54;
      attributes = attributes + 1;
    } while (lVar6 < this->relEntries->attrCount);
  }
  return 0;
}

Assistant:

RC QL_Manager::SetUpPrinterInsert(DataAttrInfo *attributes){
  RC rc = 0;
  for(int i=0; i < relEntries->attrCount ; i++){
    memcpy(attributes[i].relName, attrEntries[i].relName, MAXNAME +1);
    memcpy(attributes[i].attrName, attrEntries[i].attrName, MAXNAME + 1);
    attributes[i].attrType = attrEntries[i].attrType;
    attributes[i].attrLength = attrEntries[i].attrLength;
    attributes[i].indexNo = attrEntries[i].indexNo;
    attributes[i].offset = attrEntries[i].offset;
  }
  return (0);
}